

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_attachment2
          (Impl *this,Value *value,VkAttachmentReference2 **out_reference)

{
  bool bVar1;
  VkAttachmentReference2 *ref;
  Type pGVar2;
  Number NVar3;
  undefined8 local_30;
  
  ref = (VkAttachmentReference2 *)ScratchAllocator::allocate_raw(&this->allocator,0x20,0x10);
  if (ref != (VkAttachmentReference2 *)0x0) {
    ref->attachment = 0;
    ref->layout = VK_IMAGE_LAYOUT_UNDEFINED;
    *(undefined8 *)&ref->aspectMask = 0;
    *(undefined8 *)ref = 0;
    ref->pNext = (void *)0x0;
  }
  ref->sType = VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2;
  parse_attachment_base<VkAttachmentReference2>(ref,value);
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"aspectMask");
  if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    ref->aspectMask = (pGVar2->data_).s.length;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&stack0xffffffffffffffd0,(Ch *)value);
    NVar3.i = (I)rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::MemberEnd(value);
    if (local_30 != NVar3.i64) {
      pGVar2 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)value,"pNext");
      bVar1 = parse_pnext_chain(this,pGVar2,&ref->pNext,(StateCreatorInterface *)0x0,
                                (DatabaseInterface *)0x0,(Value *)0x0);
      if (!bVar1) {
        return false;
      }
    }
    *out_reference = ref;
    return true;
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_attachment2(const Value &value, const VkAttachmentReference2 **out_reference)
{
	auto *ret = allocator.allocate_cleared<VkAttachmentReference2>();
	ret->sType = VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2;
	parse_attachment_base(*ret, value);
	ret->aspectMask = value["aspectMask"].GetUint();

	if (value.HasMember("pNext"))
		if (!parse_pnext_chain(value["pNext"], &ret->pNext))
			return false;

	*out_reference = ret;
	return true;
}